

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O3

bool __thiscall IR::RegOpnd::IsEqualInternal(RegOpnd *this,Opnd *opnd)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((this->super_Opnd).m_kind != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x4b6,"(m_kind == OpndKindReg)","m_kind == OpndKindReg");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (opnd->m_kind == OpndKindReg) {
    if (this->m_reg == RegNOREG) {
      if ((this->m_sym != (StackSym *)opnd[1]._vptr_Opnd) ||
         (*(byte *)((long)&opnd[1].m_valueType.field_0.bits + 1) != 0)) goto LAB_00614ab4;
    }
    else if (this->m_reg != *(RegNum *)((long)&opnd[1].m_valueType.field_0.bits + 1))
    goto LAB_00614ab4;
    bVar2 = (this->super_Opnd).m_type == opnd->m_type;
  }
  else {
LAB_00614ab4:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool
RegOpnd::IsEqualInternal(Opnd *opnd)
{
    Assert(m_kind == OpndKindReg);
    return IsSameRegUntyped(opnd) && (this->GetType() == opnd->GetType());
}